

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

void handleSelectionRequest(XEvent *event)

{
  Atom AVar1;
  Display *pDVar2;
  Atom AVar3;
  long lVar4;
  ulong uVar5;
  Window WVar6;
  undefined8 uVar7;
  Atom AVar8;
  long *__s;
  size_t sVar9;
  undefined4 local_168 [2];
  XEvent reply;
  Atom targets [4];
  unsigned_long itemCount;
  unsigned_long bytesAfter;
  Display *pDStack_70;
  int actualFormat;
  Atom local_68;
  Atom formats [2];
  long local_40;
  Window local_38;
  
  AVar8 = 0;
  memset(local_168,0,0xc0);
  pDVar2 = _glfw.x11.display;
  local_168[0] = 0x1f;
  local_68 = _glfw.x11.UTF8_STRING;
  formats[0] = 0x1f;
  AVar1 = (event->xselectionrequest).property;
  if (AVar1 == 0) goto LAB_00140599;
  AVar3 = (event->xkey).time;
  if (AVar3 == _glfw.x11.TARGETS) {
    __s = reply.pad + 0x17;
    reply.pad[0x17] = _glfw.x11.TARGETS;
    targets[0] = _glfw.x11.MULTIPLE;
    targets[1] = _glfw.x11.UTF8_STRING;
    targets[2] = 0x1f;
    uVar7 = 0x20;
    sVar9 = 4;
    AVar3 = 4;
    WVar6 = (event->xkey).root;
LAB_00140450:
    XChangeProperty(pDVar2,WVar6,AVar1,AVar3,uVar7,0,__s,sVar9);
  }
  else {
    __s = *(long **)((long)_glfw.x11.keynames +
                    (ulong)((event->xkey).subwindow != _glfw.x11.PRIMARY) * 8 + -0x10);
    if (AVar3 != _glfw.x11.MULTIPLE) {
      if (AVar3 != _glfw.x11.SAVE_TARGETS) {
        AVar8 = 0;
        lVar4 = 0;
        do {
          if (AVar3 == formats[lVar4 + -1]) {
            local_38 = (event->xkey).root;
            sVar9 = strlen((char *)__s);
            uVar7 = 8;
            WVar6 = local_38;
            goto LAB_00140450;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 == 1);
        goto LAB_00140599;
      }
      uVar7 = 0x20;
      sVar9 = 0;
      __s = (long *)0x0;
      AVar3 = _glfw.x11.NULL_;
      WVar6 = (event->xkey).root;
      goto LAB_00140450;
    }
    XGetWindowProperty(_glfw.x11.display,(event->xkey).root,AVar1,0,0x7fffffffffffffff,0,
                       _glfw.x11.ATOM_PAIR,reply.pad + 0x17,(long)&bytesAfter + 4,targets + 3,
                       &itemCount,&local_40);
    local_38 = targets[3];
    if (targets[3] != 0) {
      uVar5 = 0;
      do {
        AVar1 = *(Atom *)(local_40 + uVar5 * 8);
        lVar4 = 0;
        do {
          if (AVar1 == formats[lVar4 + -1]) {
            pDStack_70 = _glfw.x11.display;
            WVar6 = (event->xkey).root;
            uVar7 = *(undefined8 *)(local_40 + 8 + uVar5 * 8);
            sVar9 = strlen((char *)__s);
            XChangeProperty(pDStack_70,WVar6,uVar7,AVar1,8,0,__s,sVar9);
            goto LAB_00140550;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 == 1);
        *(undefined8 *)(local_40 + 8 + uVar5 * 8) = 0;
LAB_00140550:
        uVar5 = uVar5 + 2;
      } while (uVar5 < local_38);
    }
    XChangeProperty(_glfw.x11.display,(event->xkey).root,(event->xselectionrequest).property,
                    _glfw.x11.ATOM_PAIR,0x20,0,local_40,local_38);
    XFree(local_40);
  }
  AVar8 = (event->xselectionrequest).property;
LAB_00140599:
  reply.xerror.resourceid = (XID)(event->xany).display;
  reply.xany.display = (Display *)(event->xkey).root;
  reply.xany.window = (event->xkey).subwindow;
  reply.xkey.root = (event->xkey).time;
  reply.xkey.time = (event->xconfigure).above;
  reply.xkey.subwindow = AVar8;
  XSendEvent(_glfw.x11.display,reply.xany.display,0,0);
  return;
}

Assistant:

static void handleSelectionRequest(XEvent* event)
{
    const XSelectionRequestEvent* request = &event->xselectionrequest;

    XEvent reply = { SelectionNotify };
    reply.xselection.property = writeTargetToProperty(request);
    reply.xselection.display = request->display;
    reply.xselection.requestor = request->requestor;
    reply.xselection.selection = request->selection;
    reply.xselection.target = request->target;
    reply.xselection.time = request->time;

    XSendEvent(_glfw.x11.display, request->requestor, False, 0, &reply);
}